

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::values_and_holders::iterator::iterator
          (iterator *this,instance *inst,type_vec *tinfo)

{
  bool bVar1;
  const_reference pptVar2;
  type_info *local_40;
  type_vec *tinfo_local;
  instance *inst_local;
  iterator *this_local;
  
  this->inst = inst;
  this->types = tinfo;
  bVar1 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::empty(this->types);
  if (bVar1) {
    local_40 = (type_info *)0x0;
  }
  else {
    pptVar2 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](this->types,0);
    local_40 = *pptVar2;
  }
  value_and_holder::value_and_holder(&this->curr,inst,local_40,0,0);
  return;
}

Assistant:

iterator(instance *inst, const type_vec *tinfo)
            : inst{inst}, types{tinfo},
            curr(inst /* instance */,
                 types->empty() ? nullptr : (*types)[0] /* type info */,
                 0, /* vpos: (non-simple types only): the first vptr comes first */
                 0 /* index */)
        {}